

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O3

void merge_cache_lcp_2way<false,unsigned_int>
               (uchar **from0,lcp_t *lcp_input0,uint *cache_input0,size_t n0,uchar **from1,
               lcp_t *lcp_input1,uint *cache_input1,size_t n1,uchar **result,lcp_t *lcp_result,
               uint *cache_result)

{
  byte bVar1;
  uchar *puVar2;
  uchar *puVar3;
  lcp_t lVar4;
  uchar **ppuVar5;
  int iVar6;
  uint uVar7;
  ostream *poVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  uchar **__dest;
  uint c;
  uint32_t local_bc;
  uchar **local_b8;
  ulong *local_b0;
  lcp_t local_a0;
  uint *local_98;
  uint *local_90;
  lcp_t *local_88;
  size_t local_78;
  string local_70;
  string local_50;
  
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"merge_cache_lcp_2way",0x14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(): n0=",7);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", n1=",5);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  local_70._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_70,1);
  check_input<unsigned_int>(from0,lcp_input0,cache_input0,n0);
  check_input<unsigned_int>(from1,lcp_input1,cache_input1,n1);
  local_98 = cache_input0 + 1;
  c = *cache_input0;
  local_90 = cache_input1 + 1;
  local_bc = *cache_input1;
  local_88 = lcp_input1;
  if (c < local_bc) {
    puVar2 = *from0;
    if (puVar2 == (uchar *)0x0) {
LAB_0024a804:
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x51,"int cmp(const unsigned char *, const unsigned char *)");
    }
    puVar3 = *from1;
    if (puVar3 == (uchar *)0x0) {
LAB_0024a823:
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x52,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar6 = strcmp((char *)puVar2,(char *)puVar3);
    if (-1 < iVar6) {
      __assert_fail("cmp(*from0, *from1) < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x449,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                   );
    }
    if ((c & 0xff000000) == (local_bc & 0xff000000) && (c & 0xff000000) != 0) {
      uVar7 = 1;
      if ((c & 0xff0000) == (local_bc & 0xff0000) && (c & 0xff0000) != 0) {
        uVar7 = ((c & 0xff00) == (local_bc & 0xff00) && (c & 0xff00) != 0) | 2;
      }
      if (puVar3[uVar7] == 0) {
        local_bc = 0;
      }
      else {
        local_bc = (uint)puVar3[uVar7] << 0x18;
        if (puVar3[(ulong)uVar7 + 1] != 0) {
          local_bc = local_bc | (uint)puVar3[(ulong)uVar7 + 1] << 0x10;
          if (puVar3[(ulong)uVar7 + 2] != '\0') {
            local_bc = local_bc | CONCAT11(puVar3[(ulong)uVar7 + 2],puVar3[(ulong)uVar7 + 3]);
          }
        }
      }
    }
    else {
      uVar7 = 0;
    }
    *result = puVar2;
    if (n0 != 1) {
      uVar10 = *lcp_input0;
      local_a0 = (lcp_t)uVar7;
LAB_00249c17:
      local_b0 = lcp_input0 + 1;
      local_b8 = from0 + 1;
      local_78 = n1;
      n0 = n0 - 1;
      __dest = result + 1;
      c = cache_input0[1];
      local_98 = cache_input0 + 2;
      ppuVar5 = local_b8;
LAB_00249cf2:
      local_b8 = ppuVar5;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Starting loop, n0=",0x12);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", n1=",5);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ...\n",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\tprev   = \'",0xb);
      puVar2 = __dest[-1];
      iVar6 = (int)poVar8;
      if (puVar2 == (uchar *)0x0) {
        std::ios::clear(iVar6 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
      }
      else {
        sVar9 = strlen((char *)puVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)puVar2,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\'\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t*from0 = \'",0xb);
      puVar2 = *local_b8;
      if (puVar2 == (uchar *)0x0) {
        std::ios::clear(iVar6 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
      }
      else {
        sVar9 = strlen((char *)puVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)puVar2,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\'\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t*from1 = \'",0xb);
      puVar2 = *from1;
      if (puVar2 == (uchar *)0x0) {
        std::ios::clear(iVar6 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
      }
      else {
        sVar9 = strlen((char *)puVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)puVar2,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\'\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\tlcp0   = ",10);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\tlcp1   = ",10);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\tcache0 = \'",0xb);
      to_str_abi_cxx11_(&local_70,c);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(char *)CONCAT71(local_70._M_dataplus._M_p._1_7_,
                                                  local_70._M_dataplus._M_p._0_1_),
                          CONCAT44(local_70._M_string_length._4_4_,(int)local_70._M_string_length));
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\'\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\tcache1 = \'",0xb);
      to_str_abi_cxx11_(&local_50,local_bc);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_50._M_dataplus._M_p,local_50._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\'\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_) !=
          &local_70.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_));
      }
      check_lcp_and_cache<unsigned_int>(__dest[-1],*local_b8,uVar10,c,*from1,local_a0,local_bc);
      if (local_a0 < uVar10) {
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                            __debug_indent_str_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\tlcp0 > lcp1\n",0xd);
        puVar2 = *local_b8;
        if (puVar2 == (uchar *)0x0) goto LAB_0024a804;
        if (*from1 == (uchar *)0x0) goto LAB_0024a823;
        iVar6 = strcmp((char *)puVar2,(char *)*from1);
        if (-1 < iVar6) {
          __assert_fail("cmp(*from0, *from1) < 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0x4ae,
                        "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                       );
        }
        *__dest = puVar2;
LAB_0024a08b:
        uVar10 = *local_b0;
        c = *local_98;
      }
      else {
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                            __debug_indent_str_abi_cxx11_._M_string_length);
        if (uVar10 < local_a0) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\tlcp0 < lcp1\n",0xd);
          if (*local_b8 == (uchar *)0x0) goto LAB_0024a804;
          puVar2 = *from1;
          if (puVar2 == (uchar *)0x0) goto LAB_0024a823;
          iVar6 = strcmp((char *)*local_b8,(char *)puVar2);
          if (iVar6 < 1) {
            __assert_fail("cmp(*from0, *from1) > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x4b7,
                          "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                         );
          }
          *__dest = puVar2;
          lVar4 = *local_88;
          local_bc = *local_90;
joined_r0x0024a178:
          local_88 = local_88 + 1;
          local_90 = local_90 + 1;
          from1 = from1 + 1;
          __dest = __dest + 1;
          local_78 = local_78 - 1;
          ppuVar5 = local_b8;
          local_a0 = lVar4;
          if (local_78 == 0) goto LAB_0024a67d;
          goto LAB_00249cf2;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\tlcp0 == lcp1\n",0xe);
        if (c < local_bc) {
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                              __debug_indent_str_abi_cxx11_._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t\tcache0 < cache1\n",0x12);
          puVar2 = *local_b8;
          if (puVar2 != (uchar *)0x0) {
            puVar3 = *from1;
            if (puVar3 != (uchar *)0x0) {
              iVar6 = strcmp((char *)puVar2,(char *)puVar3);
              if (-1 < iVar6) {
                __assert_fail("cmp(*from0, *from1) < 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                              ,0x4c6,
                              "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                             );
              }
              if (((c & 0xff000000) != 0) && ((c & 0xff000000) == (local_bc & 0xff000000))) {
                uVar10 = 1;
                if (((c & 0xff0000) != 0) && ((c & 0xff0000) == (local_bc & 0xff0000))) {
                  uVar10 = (ulong)((c & 0xff00) == (local_bc & 0xff00) && (c & 0xff00) != 0) | 2;
                }
                local_a0 = uVar10 + local_a0;
                if (puVar3[local_a0] == 0) {
                  local_bc = 0;
                }
                else {
                  local_bc = (uint)puVar3[local_a0] << 0x18;
                  if (puVar3[local_a0 + 1] != 0) {
                    local_bc = local_bc | (uint)puVar3[local_a0 + 1] << 0x10;
                    if (puVar3[local_a0 + 2] != '\0') {
                      local_bc = local_bc | CONCAT11(puVar3[local_a0 + 2],puVar3[local_a0 + 3]);
                    }
                  }
                }
              }
              *__dest = puVar2;
              uVar10 = *local_b0;
              c = *local_98;
              goto joined_r0x0024a535;
            }
            goto LAB_0024a823;
          }
          goto LAB_0024a804;
        }
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                            __debug_indent_str_abi_cxx11_._M_string_length);
        if (local_bc < c) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t\tcache0 > cache1\n",0x12);
          puVar2 = *local_b8;
          if (puVar2 != (uchar *)0x0) {
            puVar3 = *from1;
            if (puVar3 != (uchar *)0x0) {
              iVar6 = strcmp((char *)puVar2,(char *)puVar3);
              if (iVar6 < 1) {
                __assert_fail("cmp(*from0, *from1) > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                              ,0x4d6,
                              "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                             );
              }
              if (((c & 0xff000000) != 0) && ((c & 0xff000000) == (local_bc & 0xff000000))) {
                uVar11 = 1;
                if (((c & 0xff0000) != 0) && ((c & 0xff0000) == (local_bc & 0xff0000))) {
                  uVar11 = (ulong)((c & 0xff00) == (local_bc & 0xff00) && (c & 0xff00) != 0) | 2;
                }
                uVar10 = uVar11 + uVar10;
                bVar1 = puVar2[uVar10];
                if (bVar1 == 0) {
                  c = 0;
                }
                else {
                  c = (uint)bVar1 << 0x18;
                  if (puVar2[uVar10 + 1] != 0) {
                    c = (uint)bVar1 << 0x18 | (uint)puVar2[uVar10 + 1] << 0x10;
                    if (puVar2[uVar10 + 2] != '\0') {
                      c = c | CONCAT11(puVar2[uVar10 + 2],puVar2[uVar10 + 3]);
                    }
                  }
                }
              }
              *__dest = puVar3;
              lVar4 = *local_88;
              local_bc = *local_90;
              goto joined_r0x0024a178;
            }
            goto LAB_0024a823;
          }
          goto LAB_0024a804;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t\tcache0 == cache1\n",0x13);
        if ((char)c == '\0') {
          puVar2 = *local_b8;
          if (puVar2 == (uchar *)0x0) goto LAB_0024a804;
          if (*from1 == (uchar *)0x0) goto LAB_0024a823;
          iVar6 = strcmp((char *)puVar2,(char *)*from1);
          if (iVar6 != 0) {
            __assert_fail("cmp(*from0, *from1) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x4e7,
                          "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                         );
          }
          *__dest = puVar2;
          if (c != 0) goto LAB_0024a8fc;
          uVar10 = *local_b0;
          c = *local_98;
          local_bc = 0;
        }
        else {
          compare((uchar *)&local_70,*local_b8,(size_t)*from1);
          local_a0 = CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_);
          if ((int)local_70._M_string_length < 0) {
            *__dest = *local_b8;
            puVar2 = *from1;
            if (puVar2 != (uchar *)0x0) {
              if (puVar2[local_a0] == 0) {
                local_bc = 0;
              }
              else {
                local_bc = (uint)puVar2[local_a0] << 0x18;
                if (puVar2[local_a0 + 1] != 0) {
                  local_bc = local_bc | (uint)puVar2[local_a0 + 1] << 0x10;
                  if (puVar2[local_a0 + 2] != '\0') {
                    local_bc = local_bc | CONCAT11(puVar2[local_a0 + 2],puVar2[local_a0 + 3]);
                  }
                }
              }
              goto LAB_0024a08b;
            }
            goto LAB_0024a8be;
          }
          if ((int)local_70._M_string_length != 0) {
            *__dest = *from1;
            puVar2 = *local_b8;
            if (puVar2 != (uchar *)0x0) {
              if (puVar2[local_a0] == 0) {
                c = 0;
              }
              else {
                c = (uint)puVar2[local_a0] << 0x18;
                if (puVar2[local_a0 + 1] != 0) {
                  c = c | (uint)puVar2[local_a0 + 1] << 0x10;
                  if (puVar2[local_a0 + 2] != '\0') {
                    c = c | CONCAT11(puVar2[local_a0 + 2],puVar2[local_a0 + 3]);
                  }
                }
              }
              lVar4 = *local_88;
              local_bc = *local_90;
              uVar10 = local_a0;
              goto joined_r0x0024a178;
            }
            goto LAB_0024a8be;
          }
          *__dest = *local_b8;
          uVar10 = *local_b0;
          c = *local_98;
          local_bc = 0;
        }
      }
joined_r0x0024a535:
      n0 = n0 - 1;
      local_98 = local_98 + 1;
      local_b0 = local_b0 + 1;
      __dest = __dest + 1;
      ppuVar5 = local_b8 + 1;
      local_b8 = from1;
      if (n0 == 0) goto LAB_0024a77a;
      goto LAB_00249cf2;
    }
    goto LAB_0024a777;
  }
  local_b8 = from0;
  local_b0 = lcp_input0;
  if (local_bc < c) {
    puVar2 = *from0;
    if (puVar2 == (uchar *)0x0) goto LAB_0024a804;
    puVar3 = *from1;
    if (puVar3 == (uchar *)0x0) goto LAB_0024a823;
    iVar6 = strcmp((char *)puVar2,(char *)puVar3);
    if (iVar6 < 1) {
      __assert_fail("cmp(*from0, *from1) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x45c,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                   );
    }
    if ((c & 0xff000000) == (local_bc & 0xff000000) && (c & 0xff000000) != 0) {
      uVar7 = 1;
      if ((c & 0xff0000) == (local_bc & 0xff0000) && (c & 0xff0000) != 0) {
        uVar7 = ((c & 0xff00) == (local_bc & 0xff00) && (c & 0xff00) != 0) | 2;
      }
      if (puVar2[uVar7] == 0) {
        c = 0;
      }
      else {
        c = (uint)puVar2[uVar7] << 0x18;
        if (puVar2[(ulong)uVar7 + 1] != 0) {
          c = c | (uint)puVar2[(ulong)uVar7 + 1] << 0x10;
          if (puVar2[(ulong)uVar7 + 2] != '\0') {
            c = c | CONCAT11(puVar2[(ulong)uVar7 + 2],puVar2[(ulong)uVar7 + 3]);
          }
        }
      }
    }
    else {
      uVar7 = 0;
    }
    *result = puVar3;
    __dest = result + 1;
    local_78 = n1 - 1;
    if (local_78 != 0) {
      from1 = from1 + 1;
      local_88 = lcp_input1 + 1;
      local_bc = cache_input1[1];
      local_90 = cache_input1 + 2;
      uVar10 = (ulong)uVar7;
      ppuVar5 = from0;
      local_a0 = *lcp_input1;
      goto LAB_00249cf2;
    }
LAB_0024a67d:
    if (n0 == 0) {
      __assert_fail("n0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x527,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                   );
    }
    goto LAB_0024a78f;
  }
  if ((char)c == '\0') {
    puVar2 = *from0;
    if (puVar2 == (uchar *)0x0) goto LAB_0024a804;
    if (*from1 == (uchar *)0x0) goto LAB_0024a823;
    iVar6 = strcmp((char *)puVar2,(char *)*from1);
    if (iVar6 != 0) {
      __assert_fail("cmp(*from0, *from1) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x470,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                   );
    }
    if (c != 0) {
LAB_0024a8fc:
      __assert_fail("a != b or a==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x3ff,"unsigned int lcp(uint32_t, uint32_t)");
    }
    local_78 = n1;
    *result = puVar2;
    __dest = result + 1;
    n0 = n0 - 1;
    if (n0 != 0) {
      uVar10 = *lcp_input0;
      local_b0 = lcp_input0 + 1;
      c = cache_input0[1];
      local_98 = cache_input0 + 2;
      local_a0 = 0;
      local_bc = 0;
      ppuVar5 = from0 + 1;
      goto LAB_00249cf2;
    }
LAB_0024a777:
    local_78 = n1;
    __dest = result + 1;
    local_b8 = from1;
  }
  else {
    compare((uchar *)&local_70,*from0,(size_t)*from1);
    local_a0 = CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_);
    if ((int)local_70._M_string_length < 0) {
      *result = *from0;
      puVar2 = *from1;
      if (puVar2 == (uchar *)0x0) {
LAB_0024a8be:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x38,"uint32_t get_char(unsigned char *, size_t)");
      }
      if (puVar2[local_a0] == 0) {
        local_bc = 0;
      }
      else {
        local_bc = (uint)puVar2[local_a0] << 0x18;
        if (puVar2[local_a0 + 1] != 0) {
          local_bc = local_bc | (uint)puVar2[local_a0 + 1] << 0x10;
          if (puVar2[local_a0 + 2] != '\0') {
            local_bc = local_bc | CONCAT11(puVar2[local_a0 + 2],puVar2[local_a0 + 3]);
          }
        }
      }
      if (n0 != 1) {
        uVar10 = *lcp_input0;
        goto LAB_00249c17;
      }
      goto LAB_0024a777;
    }
    __dest = result + 1;
    if ((int)local_70._M_string_length != 0) {
      *result = *from1;
      puVar2 = *from0;
      if (puVar2 == (uchar *)0x0) goto LAB_0024a8be;
      if (puVar2[local_a0] == 0) {
        c = 0;
      }
      else {
        c = (uint)puVar2[local_a0] << 0x18;
        if (puVar2[local_a0 + 1] != 0) {
          c = c | (uint)puVar2[local_a0 + 1] << 0x10;
          if (puVar2[local_a0 + 2] != '\0') {
            c = c | CONCAT11(puVar2[local_a0 + 2],puVar2[local_a0 + 3]);
          }
        }
      }
      local_78 = n1 - 1;
      if (local_78 != 0) {
        from1 = from1 + 1;
        local_88 = lcp_input1 + 1;
        local_bc = cache_input1[1];
        local_90 = cache_input1 + 2;
        uVar10 = local_a0;
        ppuVar5 = from0;
        local_a0 = *lcp_input1;
        goto LAB_00249cf2;
      }
      goto LAB_0024a67d;
    }
    local_78 = n1;
    *result = *from0;
    n0 = n0 - 1;
    local_b8 = from1;
    if (n0 != 0) {
      uVar10 = *lcp_input0;
      local_b0 = lcp_input0 + 1;
      c = cache_input0[1];
      local_98 = cache_input0 + 2;
      local_bc = 0;
      ppuVar5 = from0 + 1;
      goto LAB_00249cf2;
    }
  }
LAB_0024a77a:
  n0 = local_78;
  if (local_78 == 0) {
    __assert_fail("n1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x51e,
                  "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                 );
  }
LAB_0024a78f:
  memmove(__dest,local_b8,n0 << 3);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  local_70._M_dataplus._M_p._0_1_ = 0x7e;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_70,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"merge_cache_lcp_2way",0x14);
  local_70._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_70,1);
  return;
}

Assistant:

void
merge_cache_lcp_2way(
       unsigned char** from0,  lcp_t* restrict lcp_input0, CharT* restrict cache_input0, size_t n0,
       unsigned char** from1,  lcp_t* restrict lcp_input1, CharT* restrict cache_input1, size_t n1,
       unsigned char** result, lcp_t* restrict lcp_result, CharT* restrict cache_result)
{
	debug() << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';

	check_input(from0, lcp_input0, cache_input0, n0);
	check_input(from1, lcp_input1, cache_input1, n1);

	lcp_t lcp0=0, lcp1=0;
	CharT cache0 = *cache_input0++;
	CharT cache1 = *cache_input1++;
	{
		stat_try_cache();
		if (cache0 < cache1) {
			assert(cmp(*from0, *from1) < 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache1 = get_char<CharT>(*from1, l);
				}
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				lcp1 = l;
				cache0 = *cache_input0++;
			} else {
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
			}
			if (--n0 == 0) goto finish0;
		} else if (cache0 > cache1) {
			assert(cmp(*from0, *from1) > 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache0 = get_char<CharT>(*from0, l);
				}
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp0 = l;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			} else {
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			}
			if (--n1 == 0) goto finish1;
		} else {
			if (is_end(cache0)) {
				assert(cmp(*from0, *from1) == 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = l;
					cache0 = *cache_input0++;
					cache1 = 0;
				} else {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					cache0 = *cache_input0++;
					cache1 = 0;
				}
				if (--n0 == 0) goto finish0;
			} else {
				stat_cache_useless();
				int cmp01; lcp_t lcp01;
				std::tie(cmp01, lcp01) = compare(*from0, *from1, sizeof(CharT));
				if (cmp01 < 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = get_char<CharT>(*from1, lcp01);
					if (--n0 == 0) goto finish0;
				} else if (cmp01 == 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = 0;
					if (--n0 == 0) goto finish0;
				} else {
					*result++ = *from1++;
					if (OutputLCP) *cache_result++ = cache1;
					lcp0 = lcp01;
					lcp1 = *lcp_input1++;
					cache0 = get_char<CharT>(*from0, lcp01);
					cache1 = *cache_input1++;
					if (--n1 == 0) goto finish1;
				}
			}
		}
	}
	while (true) {
		debug() << "Starting loop, n0="<<n0<<", n1="<<n1<<" ...\n"
			<< "\tprev   = '"<<*(result-1)<<"'\n"
			<< "\t*from0 = '"<<*from0<<"'\n"
			<< "\t*from1 = '"<<*from1<<"'\n"
			<< "\tlcp0   = " <<lcp0<<"\n"
			<< "\tlcp1   = " <<lcp1<<"\n"
			<< "\tcache0 = '"<<to_str(cache0)<<"'\n"
			<< "\tcache1 = '"<<to_str(cache1)<<"'\n"
			<< "\n";
		check_lcp_and_cache(*(result-1),*from0,lcp0,cache0,*from1,lcp1,cache1);
		if (lcp0 > lcp1) {
			debug() << "\tlcp0 > lcp1\n";
			assert(cmp(*from0, *from1) < 0);
			*result++ = *from0++;
			if (OutputLCP) *lcp_result++ = lcp0;
			if (OutputLCP) *cache_result++ = cache0;
			lcp0 = *lcp_input0++;
			cache0 = *cache_input0++;
			if (--n0 == 0) goto finish0;
		} else if (lcp0 < lcp1) {
			debug() << "\tlcp0 < lcp1\n";
			assert(cmp(*from0, *from1) > 0);
			*result++ = *from1++;
			if (OutputLCP) *lcp_result++ = lcp1;
			if (OutputLCP) *cache_result++ = cache1;
			lcp1 = *lcp_input1++;
			cache1 = *cache_input1++;
			if (--n1 == 0) goto finish1;
		} else {
			debug() << "\tlcp0 == lcp1\n";
			stat_try_cache();
			// Both strings in the sorted sequences have the same
			// prefix than the latest string in output. Check
			// cached characters first.
			if (cache0 < cache1) {
				debug() << "\t\tcache0 < cache1\n";
				assert(cmp(*from0, *from1) < 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp1 += l;
						cache1 = get_char<CharT>(*from1, lcp1);
					}
				}
				*result++ = *from0++;
				if (OutputLCP) *lcp_result++ = lcp0;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
				if (--n0 == 0) goto finish0;
			} else if (cache0 > cache1) {
				debug() << "\t\tcache0 > cache1\n";
				assert(cmp(*from0, *from1) > 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp0 += l;
						cache0 = get_char<CharT>(*from0, lcp0);
					}
				}
				*result++ = *from1++;
				if (OutputLCP) *lcp_result++ = lcp1;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
				if (--n1 == 0) goto finish1;
			} else {
				debug() << "\t\tcache0 == cache1\n";
				if (is_end(cache0)) {
					assert(cmp(*from0, *from1) == 0);
					if (sizeof(CharT) > 1) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 += lcp(cache0, cache1);
						cache0 = *cache_input0++;
						cache1 = 0;
					} else {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						cache0 = *cache_input0++;
					}
					if (--n0 == 0) goto finish0;
				} else {
					stat_cache_useless();
					int cmp01; lcp_t lcp01;
					std::tie(cmp01, lcp01) = compare(*from0, *from1, lcp0+sizeof(CharT));
					if (cmp01 < 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = get_char<CharT>(*from1, lcp01);
						if (--n0 == 0) goto finish0;
					} else if (cmp01 == 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = 0;
						if (--n0 == 0) goto finish0;
					} else {
						*result++ = *from1++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = lcp01;
						lcp1 = *lcp_input1++;
						cache0 = get_char<CharT>(*from0, lcp01);
						cache1 = *cache_input1++;
						if (--n1 == 0) goto finish1;
					}
				}
			}
		}
	}
finish0:
	assert(n0==0);
	assert(n1);
	if (OutputLCP) *lcp_result++ = lcp1;
	if (OutputLCP) *cache_result++ = cache1;
	std::copy(from1, from1+n1, result);
	if (OutputLCP) std::copy(lcp_input1, lcp_input1+n1, lcp_result);
	if (OutputLCP) std::copy(cache_input1, cache_input1+n1, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
finish1:
	assert(n0);
	assert(n1==0);
	if (OutputLCP) *lcp_result++ = lcp0;
	if (OutputLCP) *cache_result++ = cache0;
	std::copy(from0, from0+n0, result);
	if (OutputLCP) std::copy(lcp_input0, lcp_input0+n0, lcp_result);
	if (OutputLCP) std::copy(cache_input0, cache_input0+n0, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
}